

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O2

uint * __thiscall
Hpipe::Vec<unsigned_int>::push_back_unique<unsigned_int&>(Vec<unsigned_int> *this,uint *val)

{
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  
  puVar1 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = 0;
  do {
    uVar3 = uVar2;
    if ((ulong)((long)(this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1 >> 2) <= uVar3) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,val);
      return (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    }
    uVar2 = (ulong)((int)uVar3 + 1);
  } while (puVar1[uVar3] != *val);
  return puVar1 + uVar3;
}

Assistant:

T       *push_back_unique     ( Arg &&val ) { for( unsigned i = 0; i < this->size(); ++i ) if ( this->operator[]( i ) == val ) return &this->operator[]( i ); return push_back( std::forward<Arg>( val ) ); }